

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O1

void wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness::
     doVisitLocalSet(ParamLiveness*,wasm::Expression___(ParamLiveness *self,Expression **currp)

{
  Index *__args_1;
  LocalSet *this;
  BasicBlock *pBVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  _Storage<wasm::Type,_true> _Var4;
  bool bVar5;
  Drop *this_00;
  Block *pBVar6;
  Expression *pEVar7;
  optional<wasm::Type> type;
  Builder local_48;
  initializer_list<wasm::Expression_*> local_40;
  Expression *local_30;
  Expression **local_28;
  
  if ((*currp)->_id != LocalSetId) {
LAB_0078abde:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
  }
  if ((self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      currBasicBlock == (BasicBlock *)0x0) {
    return;
  }
  bVar5 = Function::isParam((self->
                            super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                            ).
                            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                            .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                            super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                            currFunction,*(Index *)(*currp + 1));
  if (!bVar5) {
    return;
  }
  this = (LocalSet *)*currp;
  local_28 = currp;
  if ((this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id != LocalSetId)
  goto LAB_0078abde;
  pBVar1 = (self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
           super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
           currBasicBlock;
  if (pBVar1 == (BasicBlock *)0x0) {
    bVar5 = LocalSet::isTee(this);
    local_30 = this->value;
    if (!bVar5) {
      this_00 = (Drop *)MixedArena::allocSpace
                                  (&((self->
                                     super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                     ).
                                     super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                                     .
                                     super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                     .
                                     super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                    .currModule)->allocator,0x18,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      this_00->value = local_30;
      Drop::finalize(this_00);
      *local_28 = (Expression *)this_00;
      return;
    }
    _Var4 = (_Storage<wasm::Type,_true>)
            (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id;
    if (_Var4 == (_Storage<wasm::Type,_true>)(local_30->type).id) {
      *local_28 = local_30;
      return;
    }
    local_48.wasm =
         (self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
         super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
         super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
         super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule;
    local_40._M_array = &local_30;
    local_40._M_len = 1;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = _Var4;
    pBVar6 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (&local_48,&local_40,type);
    *local_28 = (Expression *)pBVar6;
    return;
  }
  local_40._M_array = (iterator)CONCAT44(local_40._M_array._4_4_,1);
  __args_1 = &this->index;
  std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
  emplace_back<wasm::LivenessAction::What,unsigned_int&,wasm::Expression**&>
            ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
             &(pBVar1->contents).actions,(What *)&local_40,__args_1,&local_28);
  pEVar2 = this->value;
  pEVar7 = pEVar2;
  if (pEVar2->_id == LocalGetId) goto LAB_0078ab79;
  if (pEVar2->_id == IfId) {
    pEVar3 = (Expression *)pEVar2[1].type.id;
    pEVar7 = (Expression *)0x0;
    if (pEVar3->_id == LocalGetId) {
      pEVar7 = pEVar3;
    }
    if (pEVar7 != (Expression *)0x0) goto LAB_0078ab79;
    pEVar2 = *(Expression **)(pEVar2 + 2);
    if (pEVar2 != (Expression *)0x0) {
      pEVar7 = (Expression *)0x0;
      if (pEVar2->_id == LocalGetId) {
        pEVar7 = pEVar2;
      }
      goto LAB_0078ab79;
    }
  }
  pEVar7 = (Expression *)0x0;
LAB_0078ab79:
  if (pEVar7 != (Expression *)0x0) {
    LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::addCopy
              (&self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>,
               *__args_1,*(Index *)(pEVar7 + 1));
    LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::addCopy
              (&self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>,
               *__args_1,*(Index *)(pEVar7 + 1));
  }
  return;
}

Assistant:

static void doVisitLocalSet(ParamLiveness* self, Expression** currp) {
      auto* set = (*currp)->cast<LocalSet>();
      if (self->currBasicBlock && self->getFunction()->isParam(set->index)) {
        Super::doVisitLocalSet(self, currp);
      }
    }